

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-multiple-listen.c
# Opt level: O3

int run_test_multiple_listen(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  uv_loop_t *puVar2;
  uv_connect_t *req;
  int iVar3;
  undefined1 *__ptr;
  uv_handle_t *handle;
  int64_t eval_a;
  int64_t eval_b;
  sockaddr_in addr;
  undefined1 auStack_50 [56];
  uv__queue *local_18 [2];
  
  iVar3 = (int)auStack_50 + 0x28;
  auStack_50._32_8_ = (uv__queue *)0x1aa53f;
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,(sockaddr_in *)local_18);
  auStack_50._40_8_ = SEXT48(iVar1);
  auStack_50._48_8_ = (uv_handle_t *)0x0;
  if ((uv__queue *)auStack_50._40_8_ == (uv__queue *)0x0) {
    auStack_50._32_8_ = (uv__queue *)0x1aa562;
    puVar2 = uv_default_loop();
    auStack_50._32_8_ = (uv__queue *)0x1aa571;
    iVar1 = uv_tcp_init(puVar2,&server);
    auStack_50._40_8_ = SEXT48(iVar1);
    auStack_50._48_8_ = (uv_handle_t *)0x0;
    if ((uv__queue *)auStack_50._40_8_ != (uv__queue *)0x0) goto LAB_001aa7c1;
    auStack_50._32_8_ = (uv__queue *)0x1aa5a2;
    iVar1 = uv_tcp_bind(&server,(sockaddr *)local_18,0);
    auStack_50._40_8_ = SEXT48(iVar1);
    auStack_50._48_8_ = (uv_handle_t *)0x0;
    if ((uv__queue *)auStack_50._40_8_ != (uv__queue *)0x0) goto LAB_001aa7ce;
    auStack_50._32_8_ = (uv__queue *)0x1aa5d8;
    iVar1 = uv_listen((uv_stream_t *)&server,0x80,connection_cb);
    auStack_50._40_8_ = SEXT48(iVar1);
    auStack_50._48_8_ = (uv_handle_t *)0x0;
    if ((uv__queue *)auStack_50._40_8_ != (uv__queue *)0x0) goto LAB_001aa7db;
    auStack_50._32_8_ = (uv__queue *)0x1aa60e;
    iVar1 = uv_listen((uv_stream_t *)&server,0x80,connection_cb);
    auStack_50._40_8_ = SEXT48(iVar1);
    auStack_50._48_8_ = (uv_handle_t *)0x0;
    if ((uv__queue *)auStack_50._40_8_ != (uv__queue *)0x0) goto LAB_001aa7e8;
    auStack_50._32_8_ = (uv__queue *)0x1aa636;
    req = (uv_connect_t *)malloc(0x68);
    auStack_50._32_8_ = (uv__queue *)0x1aa64f;
    iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,(sockaddr_in *)local_18);
    auStack_50._40_8_ = SEXT48(iVar1);
    auStack_50._48_8_ = (uv_handle_t *)0x0;
    if ((uv__queue *)auStack_50._40_8_ != (uv__queue *)0x0) goto LAB_001aa7f5;
    if (req == (uv_connect_t *)0x0) goto LAB_001aa802;
    auStack_50._32_8_ = (uv__queue *)0x1aa67b;
    puVar2 = uv_default_loop();
    auStack_50._32_8_ = (uv__queue *)0x1aa68a;
    iVar1 = uv_tcp_init(puVar2,&client);
    auStack_50._40_8_ = SEXT48(iVar1);
    auStack_50._48_8_ = (uv_handle_t *)0x0;
    if ((uv__queue *)auStack_50._40_8_ != (uv__queue *)0x0) goto LAB_001aa807;
    auStack_50._32_8_ = (uv__queue *)0x1aa6c3;
    iVar1 = uv_tcp_connect(req,&client,(sockaddr *)local_18,connect_cb);
    auStack_50._40_8_ = SEXT48(iVar1);
    auStack_50._48_8_ = (uv_handle_t *)0x0;
    if ((uv__queue *)auStack_50._40_8_ != (uv__queue *)0x0) goto LAB_001aa814;
    auStack_50._32_8_ = (uv__queue *)0x1aa6e6;
    puVar2 = uv_default_loop();
    auStack_50._32_8_ = (uv__queue *)0x1aa6f0;
    uv_run(puVar2,UV_RUN_DEFAULT);
    local_18[0] = (uv__queue *)0x1;
    auStack_50._40_8_ = SEXT48(connection_cb_called);
    if ((uv__queue *)auStack_50._40_8_ != (uv__queue *)0x1) goto LAB_001aa821;
    local_18[0] = (uv__queue *)0x1;
    auStack_50._40_8_ = SEXT48(connect_cb_called);
    if ((uv__queue *)auStack_50._40_8_ != (uv__queue *)0x1) goto LAB_001aa82e;
    local_18[0] = (uv__queue *)0x2;
    auStack_50._40_8_ = SEXT48(close_cb_called);
    if ((uv__queue *)auStack_50._40_8_ == (uv__queue *)0x2) {
      auStack_50._32_8_ = (uv__queue *)0x1aa75e;
      puVar2 = uv_default_loop();
      auStack_50._32_8_ = (uv__queue *)0x1aa772;
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      auStack_50._32_8_ = (uv__queue *)0x1aa77c;
      uv_run(puVar2,UV_RUN_DEFAULT);
      local_18[0] = (uv__queue *)0x0;
      auStack_50._32_8_ = (uv__queue *)0x1aa78a;
      puVar2 = uv_default_loop();
      auStack_50._32_8_ = (uv__queue *)0x1aa792;
      iVar1 = uv_loop_close(puVar2);
      auStack_50._40_8_ = SEXT48(iVar1);
      if (local_18[0] == (uv__queue *)auStack_50._40_8_) {
        auStack_50._32_8_ = (uv__queue *)0x1aa7ac;
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001aa848;
    }
  }
  else {
    auStack_50._32_8_ = (uv__queue *)0x1aa7c1;
    run_test_multiple_listen_cold_1();
LAB_001aa7c1:
    auStack_50._32_8_ = (uv__queue *)0x1aa7ce;
    run_test_multiple_listen_cold_2();
LAB_001aa7ce:
    auStack_50._32_8_ = (uv__queue *)0x1aa7db;
    run_test_multiple_listen_cold_3();
LAB_001aa7db:
    auStack_50._32_8_ = (uv__queue *)0x1aa7e8;
    run_test_multiple_listen_cold_4();
LAB_001aa7e8:
    auStack_50._32_8_ = (uv__queue *)0x1aa7f5;
    run_test_multiple_listen_cold_5();
LAB_001aa7f5:
    auStack_50._32_8_ = (uv__queue *)0x1aa802;
    run_test_multiple_listen_cold_6();
LAB_001aa802:
    auStack_50._32_8_ = (uv__queue *)0x1aa807;
    run_test_multiple_listen_cold_13();
LAB_001aa807:
    auStack_50._32_8_ = (uv__queue *)0x1aa814;
    run_test_multiple_listen_cold_7();
LAB_001aa814:
    auStack_50._32_8_ = (uv__queue *)0x1aa821;
    run_test_multiple_listen_cold_8();
LAB_001aa821:
    auStack_50._32_8_ = (uv__queue *)0x1aa82e;
    run_test_multiple_listen_cold_9();
LAB_001aa82e:
    auStack_50._32_8_ = (uv__queue *)0x1aa83b;
    run_test_multiple_listen_cold_10();
  }
  auStack_50._32_8_ = (uv__queue *)0x1aa848;
  run_test_multiple_listen_cold_11();
LAB_001aa848:
  auStack_50._32_8_ = connection_cb;
  run_test_multiple_listen_cold_12();
  auStack_50._32_8_ = SEXT48(iVar3);
  auStack_50._24_8_ = (uv_close_cb)0x0;
  if ((uv__queue *)auStack_50._32_8_ == (uv__queue *)0x0) {
    auStack_50._8_8_ = (uv_loop_t *)0x1aa889;
    uv_close((uv_handle_t *)&server,close_cb);
    connection_cb_called = connection_cb_called + 1;
    return extraout_EAX;
  }
  __ptr = auStack_50 + 0x20;
  iVar1 = (int)auStack_50 + 0x18;
  auStack_50._8_8_ = close_cb;
  connection_cb_cold_1();
  if (__ptr != (undefined1 *)0x0) {
    close_cb_called = close_cb_called + 1;
    return extraout_EAX_00;
  }
  auStack_50._0_8_ = connect_cb;
  close_cb_cold_1();
  if (__ptr == (undefined1 *)0x0) {
    connect_cb_cold_2();
  }
  else {
    auStack_50._0_8_ = SEXT48(iVar1);
    if ((code *)auStack_50._0_8_ == (code *)0x0) {
      free(__ptr);
      uv_close((uv_handle_t *)&client,close_cb);
      connect_cb_called = connect_cb_called + 1;
      return extraout_EAX_01;
    }
  }
  handle = (uv_handle_t *)auStack_50;
  connect_cb_cold_1();
  iVar1 = uv_is_closing(handle);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close(handle,(uv_close_cb)0x0);
  return extraout_EAX_02;
}

Assistant:

static void start_server(void) {
  struct sockaddr_in addr;
  int r;

  ASSERT_OK(uv_ip4_addr("0.0.0.0", TEST_PORT, &addr));

  r = uv_tcp_init(uv_default_loop(), &server);
  ASSERT_OK(r);

  r = uv_tcp_bind(&server, (const struct sockaddr*) &addr, 0);
  ASSERT_OK(r);

  r = uv_listen((uv_stream_t*)&server, 128, connection_cb);
  ASSERT_OK(r);

  r = uv_listen((uv_stream_t*)&server, 128, connection_cb);
  ASSERT_OK(r);
}